

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CService * __thiscall CNode::GetAddrLocal(CNode *this)

{
  long lVar1;
  char *in_RSI;
  CService *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock31;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CService *in_stack_ffffffffffffff90;
  char *pcVar2;
  char *pszFile;
  CService *mutexIn;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = "m_addr_local_mutex";
  pszFile = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  mutexIn = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (Mutex *)0xff5615);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,(AnnotatedMixin<std::mutex> *)mutexIn,in_RSI,pszFile,
             (int)((ulong)pcVar2 >> 0x20),SUB81((ulong)pcVar2 >> 0x18,0));
  CService::CService(in_RDI,in_stack_ffffffffffffff90);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CService CNode::GetAddrLocal() const
{
    AssertLockNotHeld(m_addr_local_mutex);
    LOCK(m_addr_local_mutex);
    return m_addr_local;
}